

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * contextMalloc(sqlite3_context *context,i64 nByte)

{
  sqlite3 *n;
  long in_RSI;
  sqlite3_context *in_RDI;
  sqlite3 *db;
  char *z;
  void *local_18;
  
  n = sqlite3_context_db_handle(in_RDI);
  if (n->aLimit[0] < in_RSI) {
    sqlite3_result_error_toobig((sqlite3_context *)0x226a6c);
    local_18 = (void *)0x0;
  }
  else {
    local_18 = sqlite3Malloc((u64)n);
    if (local_18 == (void *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x226a98);
    }
  }
  return local_18;
}

Assistant:

static void *contextMalloc(sqlite3_context *context, i64 nByte){
  char *z;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( nByte>0 );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH] );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  if( nByte>db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    z = 0;
  }else{
    z = sqlite3Malloc(nByte);
    if( !z ){
      sqlite3_result_error_nomem(context);
    }
  }
  return z;
}